

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O1

void __thiscall CompilationContext::inverseWarningsSuppression(CompilationContext *this)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  vector<int,_std::allocator<int>_> newSuppressWarnings;
  vector<int,_std::allocator<int>_> local_38;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  lVar4 = 0;
  do {
    piVar1 = (this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar1;
    if (lVar2 != 0) {
      lVar2 = lVar2 >> 2;
      lVar3 = 0;
      do {
        if (analyzer_messages[lVar4].intId == piVar1[lVar3]) goto LAB_0010798e;
        lVar3 = lVar3 + 1;
      } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    }
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_38,
                 (iterator)
                 local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&analyzer_messages[lVar4].intId);
    }
    else {
      *local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = analyzer_messages[lVar4].intId;
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
LAB_0010798e:
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x59) {
      std::vector<int,_std::allocator<int>_>::operator=(&this->suppressWarnings,&local_38);
      if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void CompilationContext::inverseWarningsSuppression()
{
  std::vector<int> newSuppressWarnings;
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
  {
    bool found = false;
    for (size_t j = 0; j < suppressWarnings.size(); j++)
    {
      if (analyzer_messages[i].intId == suppressWarnings[j])
      {
        found = true;
        break;
      }
    }

    if (!found)
      newSuppressWarnings.push_back(analyzer_messages[i].intId);
  }

  suppressWarnings = newSuppressWarnings;
}